

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * flatbuffers::kotlin::KotlinGenerator::OffsetWrapperOneLine
                   (string *__return_storage_ptr__,string *offset,string *found,string *not_found)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *not_found_local;
  string *found_local;
  string *offset_local;
  
  local_28 = not_found;
  not_found_local = found;
  found_local = offset;
  offset_local = __return_storage_ptr__;
  std::operator+(&local_a8,"val o = __offset(",offset);
  std::operator+(&local_88,&local_a8,"); return if (o != 0) ");
  std::operator+(&local_68,&local_88,not_found_local);
  std::operator+(&local_48,&local_68," else ");
  std::operator+(__return_storage_ptr__,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string OffsetWrapperOneLine(const std::string &offset,
                                          const std::string &found,
                                          const std::string &not_found) {
    return "val o = __offset(" + offset + "); return if (o != 0) " + found +
           " else " + not_found;
  }